

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_memory_buffer<char,_5UL,_std::allocator<char>_>::move
          (basic_memory_buffer<char,_5UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_5UL,_std::allocator<char>_> *other)

{
  basic_buffer<char> *buf_data;
  size_t sVar1;
  size_t buf_capacity;
  basic_buffer<char> *in_RSI;
  basic_buffer<char> *in_RDI;
  size_t capacity;
  size_t size;
  char *data;
  allocator<char> *other_alloc;
  allocator<char> *this_alloc;
  size_t in_stack_ffffffffffffffa8;
  basic_buffer<char> *in_stack_ffffffffffffffb0;
  char *__last;
  
  buf_data = (basic_buffer<char> *)internal::basic_buffer<char>::data(in_RSI);
  sVar1 = internal::basic_buffer<char>::size(in_RSI);
  buf_capacity = internal::basic_buffer<char>::capacity(in_RSI);
  if (buf_data == in_RSI + 1) {
    internal::basic_buffer<char>::set(in_RDI,(char *)(in_RDI + 1),buf_capacity);
    in_stack_ffffffffffffffb0 = in_RSI + 1;
    __last = (char *)((long)&in_RSI[1]._vptr_basic_buffer + sVar1);
    internal::make_checked<char>((char *)(in_RDI + 1),buf_capacity);
    std::uninitialized_copy<char*,char*>((char *)in_RDI,__last,(char *)in_stack_ffffffffffffffb0);
  }
  else {
    internal::basic_buffer<char>::set(in_RDI,(char *)buf_data,buf_capacity);
    internal::basic_buffer<char>::set(in_RSI,(char *)(in_RSI + 1),0);
  }
  internal::basic_buffer<char>::resize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void move(basic_memory_buffer &other) {
    Allocator &this_alloc = *this, &other_alloc = other;
    this_alloc = std::move(other_alloc);
    T* data = other.data();
    std::size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              internal::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }